

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O2

void mbedtls_ecjpake_init(mbedtls_ecjpake_context *ctx)

{
  ctx->md_type = MBEDTLS_MD_NONE;
  mbedtls_ecp_group_init(&ctx->grp);
  ctx->point_format = 0;
  mbedtls_ecp_point_init(&ctx->Xm1);
  mbedtls_ecp_point_init(&ctx->Xm2);
  mbedtls_ecp_point_init(&ctx->Xp1);
  mbedtls_ecp_point_init(&ctx->Xp2);
  mbedtls_ecp_point_init(&ctx->Xp);
  mbedtls_mpi_init(&ctx->xm1);
  mbedtls_mpi_init(&ctx->xm2);
  mbedtls_mpi_init(&ctx->s);
  return;
}

Assistant:

void mbedtls_ecjpake_init(mbedtls_ecjpake_context *ctx)
{
    ctx->md_type = MBEDTLS_MD_NONE;
    mbedtls_ecp_group_init(&ctx->grp);
    ctx->point_format = MBEDTLS_ECP_PF_UNCOMPRESSED;

    mbedtls_ecp_point_init(&ctx->Xm1);
    mbedtls_ecp_point_init(&ctx->Xm2);
    mbedtls_ecp_point_init(&ctx->Xp1);
    mbedtls_ecp_point_init(&ctx->Xp2);
    mbedtls_ecp_point_init(&ctx->Xp);

    mbedtls_mpi_init(&ctx->xm1);
    mbedtls_mpi_init(&ctx->xm2);
    mbedtls_mpi_init(&ctx->s);
}